

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.cpp
# Opt level: O0

void anon_unknown.dwarf_6c987::write_value_label(FILE *report_dot,Value *v,bool inline_mode)

{
  bool inline_mode_local;
  Value *v_local;
  FILE *report_dot_local;
  
  if (inline_mode) {
    fprintf((FILE *)report_dot,"=> ");
  }
  if (v->type == MEM) {
    fprintf((FILE *)report_dot,"mem %06X",(ulong)v->adress);
  }
  else {
    fprint_thing(report_dot,1 << ((byte)v->type & 0x1f));
  }
  if (inline_mode) {
    fprintf((FILE *)report_dot,"=");
  }
  else {
    fprintf((FILE *)report_dot,"\n");
  }
  if ((v->wide & 1U) == 0) {
    fprintf((FILE *)report_dot,"%02X",(ulong)v->value);
  }
  else {
    fprintf((FILE *)report_dot,"%04X",(ulong)v->value);
  }
  fprintf((FILE *)report_dot,"\n");
  return;
}

Assistant:

void write_value_label(FILE *report_dot, const snestistics::tracking::Value &v, const bool inline_mode = false) {
	if (inline_mode) {
		fprintf(report_dot, "=> ");
	}
	if (v.type == tracking::Value::MEM) {
		fprintf(report_dot, "mem %06X", v.adress);
	} else {
		fprint_thing(report_dot, 1<<(uint32_t)v.type);
	}
	if (inline_mode) {
		fprintf(report_dot, "=");
	} else {
		fprintf(report_dot, "\n");
	}
	if (v.wide) {
		fprintf(report_dot, "%04X", v.value);
	} else {
		fprintf(report_dot, "%02X", v.value);
	}
	fprintf(report_dot, "\n");
}